

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error set_termios(int fd,termios *tty)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = tcflush(fd,0);
  if ((iVar1 != -1) && (iVar1 = tcsetattr(fd,0,(termios *)tty), iVar1 != -1)) {
    return CIO_SUCCESS;
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

static enum cio_error set_termios(int fd, struct termios *tty)
{
	int ret = tcflush(fd, TCIFLUSH);
	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}
	ret = tcsetattr(fd, TCSANOW, tty);
	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}